

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall
Random_keys::cruzamento6
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  int iVar1;
  int i;
  RK_Individual *filho_local;
  RK_Individual *pai2_local;
  RK_Individual *pai1_local;
  Random_keys *this_local;
  
  iVar1 = rand();
  iVar1 = iVar1 % 5;
  if (iVar1 == 0) {
    cruzamento1(this,pai1,pai2,filho);
  }
  if (iVar1 == 1) {
    cruzamento2(this,pai1,pai2,filho);
  }
  if (iVar1 == 2) {
    cruzamento3(this,pai1,pai2,filho);
  }
  if (iVar1 == 3) {
    cruzamento4(this,pai1,pai2,filho);
  }
  if (iVar1 == 4) {
    cruzamento5(this,pai1,pai2,filho);
  }
  return;
}

Assistant:

void Random_keys::cruzamento6(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    int i = rand() % 5;

    if(i==0)
        this->cruzamento1(pai1, pai2, filho);
    if(i==1)
        this->cruzamento2(pai1, pai2, filho);
    if(i==2)
        this->cruzamento3(pai1, pai2, filho);
    if(i==3)
        this->cruzamento4(pai1, pai2, filho);
    if(i==4)
        this->cruzamento5(pai1, pai2, filho);

}